

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

bool __thiscall mapbox::detail::Earcut<unsigned_int>::isEar(Earcut<unsigned_int> *this,Node *ear)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pNVar5 = ear->prev;
  pNVar6 = ear->next;
  dVar1 = ear->x;
  dVar2 = ear->y;
  if (0.0 <= (pNVar6->x - dVar1) * (dVar2 - pNVar5->y) - (pNVar6->y - dVar2) * (dVar1 - pNVar5->x))
  {
LAB_003b3885:
    bVar8 = false;
  }
  else {
    for (pNVar7 = pNVar6->next; bVar8 = pNVar7 == pNVar5, !bVar8; pNVar7 = pNVar7->next) {
      dVar3 = pNVar7->x;
      dVar4 = pNVar7->y;
      dVar9 = pNVar6->x - dVar3;
      dVar10 = pNVar5->y - dVar4;
      dVar12 = pNVar5->x - dVar3;
      dVar11 = pNVar6->y - dVar4;
      if (dVar12 * dVar11 <= dVar9 * dVar10) {
        if (((dVar10 * (dVar1 - dVar3) <= dVar12 * (dVar2 - dVar4)) &&
            (dVar9 * (dVar2 - dVar4) <= (dVar1 - dVar3) * dVar11)) &&
           (0.0 <= (pNVar7->next->x - dVar3) * (dVar4 - pNVar7->prev->y) -
                   (pNVar7->next->y - dVar4) * (dVar3 - pNVar7->prev->x))) goto LAB_003b3885;
      }
    }
  }
  return bVar8;
}

Assistant:

bool Earcut<N>::isEar(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // now make sure we don't have other points inside the potential ear
    Node* p = ear->next->next;

    while (p != ear->prev) {
        if (pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->next;
    }

    return true;
}